

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O3

string * __thiscall
cmExportInstallFileGenerator::GetConfigImportFileGlob_abi_cxx11_
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->super_cmExportFileGenerator).FileBase._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->super_cmExportFileGenerator).FileBase._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,
             (ulong)(this->super_cmExportFileGenerator).FileExt._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportInstallFileGenerator::GetConfigImportFileGlob()
{
  std::string glob = this->FileBase;
  glob += "-*";
  glob += this->FileExt;
  return glob;
}